

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ps2raster.cpp
# Opt level: O0

uint32 rw::ps2::getSizeNativeTexture(Texture *tex)

{
  size_t sVar1;
  size_t sVar2;
  Ps2Raster *ras;
  uint32 size;
  Texture *tex_local;
  
  sVar1 = strlen(tex->name);
  sVar2 = strlen(tex->mask);
  return *(int *)((long)&tex->raster->stride + (long)nativeRasterOffset) +
         *(int *)(&tex->raster->field_0x24 + nativeRasterOffset) +
         ((int)sVar1 + 0x10U & 0xfffffffc) + ((int)sVar2 + 0x10U & 0xfffffffc) + 0x78;
}

Assistant:

uint32
getSizeNativeTexture(Texture *tex)
{
	uint32 size = 12 + 8;
	size += 12 + strlen(tex->name)+4 & ~3;
	size += 12 + strlen(tex->mask)+4 & ~3;
	size += 12;
	size += 12 + 64;
	Ps2Raster *ras = GETPS2RASTEREXT(tex->raster);
	size += 12 + ras->pixelSize + ras->paletteSize;
	return size;
}